

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O0

void __thiscall skiwi::reg_alloc::make_all_available(reg_alloc *this)

{
  byte bVar1;
  uint uVar2;
  size_type sVar3;
  reference __k;
  byte *pbVar4;
  pair<std::_Rb_tree_const_iterator<unsigned_char>,_bool> pVar5;
  value_type_conflict3 local_2c;
  _Rb_tree_const_iterator<unsigned_char> _Stack_28;
  uint32_t i_1;
  undefined1 local_20;
  byte local_11;
  reg_alloc *prStack_10;
  uint8_t i;
  reg_alloc *this_local;
  
  local_11 = 0;
  prStack_10 = this;
  while( true ) {
    uVar2 = (uint)local_11;
    sVar3 = std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
            size(&this->available_registers);
    bVar1 = local_11;
    if (((uint)sVar3 & 0xff) <= uVar2) break;
    __k = std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
          operator[](&this->available_registers,(ulong)local_11);
    pbVar4 = std::
             map<assembler::asmcode::operand,_unsigned_char,_std::less<assembler::asmcode::operand>,_std::allocator<std::pair<const_assembler::asmcode::operand,_unsigned_char>_>_>
             ::operator[](&this->register_to_index,__k);
    *pbVar4 = bVar1;
    pVar5 = std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::
            insert(&this->free_registers,&local_11);
    _Stack_28 = pVar5.first._M_node;
    local_20 = pVar5.second;
    local_11 = local_11 + 1;
  }
  for (local_2c = 0; local_2c < this->nr_locals; local_2c = local_2c + 1) {
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
              (&this->free_locals,&local_2c);
  }
  return;
}

Assistant:

void reg_alloc::make_all_available()
  {
  for (uint8_t i = 0; i < (uint8_t)available_registers.size(); ++i)
    {
    register_to_index[available_registers[i]] = i;
    free_registers.insert(i);
    }

  for (uint32_t i = 0; i < nr_locals; ++i)
    free_locals.insert(i);
  }